

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractslider.cpp
# Opt level: O0

void __thiscall QAbstractSlider::changeEvent(QAbstractSlider *this,QEvent *ev)

{
  bool bVar1;
  Type TVar2;
  QAbstractSliderPrivate *event;
  QWidget *in_RSI;
  QAbstractSliderPrivate *d;
  
  event = d_func((QAbstractSlider *)0x50e4b1);
  TVar2 = QEvent::type((QEvent *)in_RSI);
  if ((TVar2 == EnabledChange) && (bVar1 = QWidget::isEnabled((QWidget *)0x50e4d1), !bVar1)) {
    QBasicTimer::stop();
    setSliderDown((QAbstractSlider *)in_RSI,SUB81((ulong)event >> 0x38,0));
  }
  QWidget::changeEvent(in_RSI,(QEvent *)event);
  return;
}

Assistant:

void QAbstractSlider::changeEvent(QEvent *ev)
{
    Q_D(QAbstractSlider);
    switch (ev->type()) {
    case QEvent::EnabledChange:
        if (!isEnabled()) {
            d->repeatActionTimer.stop();
            setSliderDown(false);
        }
        Q_FALLTHROUGH();
    default:
        QWidget::changeEvent(ev);
    }
}